

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
ValidatorTest_ReturnUnreachable_Test::TestBody(ValidatorTest_ReturnUnreachable_Test *this)

{
  __node_base_ptr *this_00;
  char cVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  Expression *body;
  undefined1 auVar4 [16];
  Name name;
  undefined1 local_470 [8];
  Module module;
  undefined1 local_78 [32];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  undefined1 local_48 [8];
  Type TStack_40;
  long local_38;
  Module *local_30;
  
  ::wasm::Module::Module((Module *)local_470);
  auVar4 = ::wasm::IString::interned(4,"func",0);
  local_78._0_8_ = (char *)0x0;
  local_78._8_8_ = (char *)0x0;
  local_78._16_8_ = 0;
  ::wasm::HeapType::HeapType
            ((HeapType *)&module.tagsMap._M_h._M_single_bucket,(Signature)ZEXT816(0));
  this_00 = &module.typeIndices._M_h._M_single_bucket;
  local_48 = (undefined1  [8])0x0;
  TStack_40.id = 0;
  local_38 = 0;
  puVar2 = (undefined1 *)MixedArena::allocSpace((MixedArena *)this_00,0x10,8);
  *puVar2 = 0x17;
  *(undefined8 *)(puVar2 + 8) = 1;
  puVar3 = (undefined1 *)MixedArena::allocSpace((MixedArena *)this_00,0x18,8);
  *puVar3 = 0x13;
  *(undefined8 *)(puVar3 + 8) = 1;
  *(undefined1 **)(puVar3 + 0x10) = puVar2;
  body = (Expression *)local_48;
  name.super_IString.str._M_str = auVar4._0_8_;
  name.super_IString.str._M_len = (size_t)&local_30;
  ::wasm::Builder::makeFunction
            (name,auVar4._8_8_,(HeapType)local_78,
             (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)
             module.tagsMap._M_h._M_single_bucket,body);
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38 - (long)local_48);
  }
  if ((char *)local_78._0_8_ != (char *)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  cVar1 = ::wasm::WasmValidator::validate((Function *)local_78,local_30,(uint)local_470);
  local_48 = (undefined1  [8])(CONCAT71(local_48._1_7_,cVar1) ^ 1);
  TStack_40.id = 0;
  if (cVar1 != '\0') {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_78,(internal *)local_48,
               (AssertionResult *)"WasmValidator{}.validate(func.get(), module, flags)","true",
               "false",(char *)body);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/validator.cpp"
               ,0x42,(char *)local_78._0_8_);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    if (local_58._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_58._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)TStack_40.id !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&TStack_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)TStack_40.id
                  );
    }
  }
  if (local_30 != (Module *)0x0) {
    std::default_delete<wasm::Function>::operator()
              ((default_delete<wasm::Function> *)&local_30,(Function *)local_30);
  }
  ::wasm::Module::~Module((Module *)local_470);
  return;
}

Assistant:

TEST(ValidatorTest, ReturnUnreachable) {
  Module module;
  Builder builder(module);

  // (return (unreachable)) should be invalid if a function has no return type.
  auto func =
    builder.makeFunction("func",
                         {},
                         Signature(Type::none, Type::none),
                         {},
                         builder.makeReturn(builder.makeUnreachable()));

  auto flags =
    WasmValidator::FlagValues::Globally | WasmValidator::FlagValues::Quiet;
  EXPECT_FALSE(WasmValidator{}.validate(func.get(), module, flags));
}